

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O2

int netaddr_acl_from_strarray(netaddr_acl *acl,const_strarray *value)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  netaddr *pnVar4;
  size_t *psVar5;
  char *src;
  size_t sVar6;
  char *pcVar7;
  size_t __nmemb;
  
  netaddr_acl_remove(acl);
  sVar6 = 0;
  __nmemb = 0;
  for (pcVar7 = value->value; (pcVar7 != (char *)0x0 && (pcVar7 < value->value + value->length));
      pcVar7 = pcVar7 + sVar3 + 1) {
    iVar2 = netaddr_acl_handle_keywords(acl,pcVar7);
    if (iVar2 != 0) {
      if (*pcVar7 == '-') {
        __nmemb = __nmemb + 1;
      }
      else {
        sVar6 = sVar6 + 1;
      }
    }
    sVar3 = strlen(pcVar7);
  }
  if (sVar6 == 0) {
LAB_001285ea:
    if (__nmemb != 0) {
      pnVar4 = (netaddr *)calloc(__nmemb,0x12);
      acl->reject = pnVar4;
      if (pnVar4 == (netaddr *)0x0) goto LAB_00128687;
    }
    for (pcVar7 = value->value;
        (iVar2 = 0, pcVar7 != (char *)0x0 && (pcVar7 < value->value + value->length));
        pcVar7 = pcVar7 + sVar6 + 1) {
      iVar2 = netaddr_acl_handle_keywords(acl,pcVar7);
      if (iVar2 != 0) {
        cVar1 = *pcVar7;
        if ((cVar1 == '-') || (src = pcVar7, cVar1 == '+')) {
          src = pcVar7 + 1;
        }
        if (cVar1 == '-') {
          iVar2 = netaddr_from_string(acl->reject + acl->reject_count,src);
          psVar5 = &acl->reject_count;
        }
        else {
          iVar2 = netaddr_from_string(acl->accept + acl->accept_count,src);
          psVar5 = &acl->accept_count;
        }
        if (iVar2 != 0) goto LAB_00128687;
        *psVar5 = *psVar5 + 1;
      }
      sVar6 = strlen(pcVar7);
    }
  }
  else {
    pnVar4 = (netaddr *)calloc(sVar6,0x12);
    acl->accept = pnVar4;
    if (pnVar4 != (netaddr *)0x0) goto LAB_001285ea;
LAB_00128687:
    netaddr_acl_remove(acl);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
netaddr_acl_from_strarray(struct netaddr_acl *acl, const struct const_strarray *value) {
  size_t accept_count, reject_count;
  const char *ptr, *addr;

  accept_count = 0;
  reject_count = 0;

  /* clear acl struct and free existing data */
  netaddr_acl_remove(acl);

  /* count number of address entries */
  strarray_for_each_element(value, ptr) {
    if (netaddr_acl_handle_keywords(acl, ptr) == 0) {
      continue;
    }

    if (ptr[0] == '-') {
      reject_count++;
    }
    else {
      accept_count++;
    }
  }

  /* allocate memory */
  if (accept_count > 0) {
    acl->accept = calloc(accept_count, sizeof(struct netaddr));
    if (acl->accept == NULL) {
      goto from_entry_error;
    }
  }
  if (reject_count > 0) {
    acl->reject = calloc(reject_count, sizeof(struct netaddr));
    if (acl->reject == NULL) {
      goto from_entry_error;
    }
  }

  /* read netaddr strings into buffers */
  strarray_for_each_element(value, ptr) {
    if (netaddr_acl_handle_keywords(acl, ptr) == 0) {
      continue;
    }

    if (*ptr == '-' || *ptr == '+') {
      addr = &ptr[1];
    }
    else {
      addr = ptr;
    }

    if (*ptr == '-') {
      if (netaddr_from_string(&acl->reject[acl->reject_count], addr)) {
        goto from_entry_error;
      }
      acl->reject_count++;
    }
    else {
      if (netaddr_from_string(&acl->accept[acl->accept_count], addr)) {
        goto from_entry_error;
      }
      acl->accept_count++;
    }
  }
  return 0;

from_entry_error:
  netaddr_acl_remove(acl);
  return -1;
}